

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

bool __thiscall Assimp::Importer::SetPropertyMatrix(Importer *this,char *szName,aiMatrix4x4 *value)

{
  bool bVar1;
  
  bVar1 = SetGenericProperty<aiMatrix4x4t<float>>(&this->pimpl->mMatrixProperties,szName,value);
  return bVar1;
}

Assistant:

bool Importer::SetPropertyMatrix(const char* szName, const aiMatrix4x4& value)
{
    bool existing;
    ASSIMP_BEGIN_EXCEPTION_REGION();
        existing = SetGenericProperty<aiMatrix4x4>(pimpl->mMatrixProperties, szName,value);
    ASSIMP_END_EXCEPTION_REGION(bool);
    return existing;
}